

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::
TypedExpectation<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int)>
::ShouldHandleArguments
          (TypedExpectation<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if ((this->super_ExpectationBase).retired_ == false) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase);
    if (bVar1) {
      bVar1 = Matches(this,args);
      return bVar1;
    }
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }